

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_time(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  anon_union_8_3_18420de5_for_x in_RAX;
  time_t tt;
  anon_union_8_3_18420de5_for_x local_18;
  
  local_18 = in_RAX;
  time(&local_18.iVal);
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = local_18;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_time(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	time_t tt;
	SXUNUSED(nArg); /* cc warning */
	SXUNUSED(apArg);
	/* Extract the current time */
	time(&tt);
	/* Return as 64-bit integer */
	jx9_result_int64(pCtx, (jx9_int64)tt);
	return  JX9_OK;
}